

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::moveEvent(QMdiSubWindow *this,QMoveEvent *moveEvent)

{
  QMdiSubWindowPrivate *this_00;
  
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    QWidget::moveEvent(&this->super_QWidget,moveEvent);
    return;
  }
  if (this_00->isMaximizeMode == true) {
    QMdiSubWindowPrivate::ensureWindowState(this_00,WindowMaximized);
    return;
  }
  return;
}

Assistant:

void QMdiSubWindow::moveEvent(QMoveEvent *moveEvent)
{
    if (!parent()) {
        QWidget::moveEvent(moveEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->isMaximizeMode)
        d->ensureWindowState(Qt::WindowMaximized);
}